

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

void stb_sha1(stb_uchar *output,stb_uchar *buffer,stb_uint len)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  byte *chunk;
  uint uVar8;
  uchar final_block [128];
  stb_uint local_d8 [8];
  byte abStack_b8 [136];
  
  local_d8[0] = 0x67452301;
  local_d8[1] = 0xefcdab89;
  local_d8[2] = 0x98badcfe;
  local_d8[3] = 0x10325476;
  local_d8[4] = 0xc3d2e1f0;
  uVar2 = len & 0xffffffc0;
  uVar1 = uVar2 - 0x40;
  if ((len + 9 & 0xffffffc0) != uVar2) {
    uVar1 = uVar2;
  }
  uVar2 = uVar1 + 0x80;
  if (uVar2 < len + 9) {
    __assert_fail("end_start + 128 >= len+9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0x18cd,"void stb_sha1(stb_uchar *, stb_uchar *, stb_uint)");
  }
  if (0x36 < len && len <= uVar1) {
    __assert_fail("end_start < len || len < 64-9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                  ,0x18ce,"void stb_sha1(stb_uchar *, stb_uchar *, stb_uint)");
  }
  uVar4 = 0;
  if (len < uVar1) {
    uVar4 = (ulong)-uVar1;
  }
  uVar6 = (int)uVar4 + uVar1;
  if (uVar6 < len) {
    uVar7 = (ulong)uVar6;
    do {
      abStack_b8[uVar4] = buffer[uVar7];
      uVar4 = (ulong)((int)uVar4 + 1);
      uVar7 = uVar7 + 1;
    } while ((uint)uVar7 < len);
  }
  iVar3 = (int)uVar4;
  abStack_b8[uVar4] = 0x80;
  uVar6 = iVar3 + 1;
  if (uVar6 < 0x7b) {
    uVar8 = 0x79 - iVar3;
    memset(abStack_b8 + uVar6,0,(ulong)uVar8 + 1);
    iVar3 = uVar8 + uVar6;
    uVar6 = uVar6 + uVar8 + 1;
  }
  abStack_b8[uVar6] = (byte)(len >> 0x1d);
  abStack_b8[iVar3 + 2] = (byte)(len >> 0x15);
  abStack_b8[iVar3 + 3] = (byte)(len >> 0xd);
  abStack_b8[iVar3 + 4] = (byte)(len >> 5);
  abStack_b8[iVar3 + 5] = (char)len << 3;
  if (iVar3 == 0x7a) {
    if (uVar2 != 0) {
      uVar4 = 0;
      do {
        uVar7 = uVar4 + 0x40;
        if (uVar7 < uVar1 + 0x40) {
          chunk = buffer + uVar4;
        }
        else {
          chunk = abStack_b8 + ((int)uVar4 + -uVar1);
        }
        stb__sha1(chunk,local_d8);
        uVar4 = uVar7;
      } while (uVar7 < uVar2);
    }
    lVar5 = 0;
    do {
      uVar1 = local_d8[lVar5];
      *(uint *)(output + lVar5 * 4) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 5);
    return;
  }
  __assert_fail("j == 128 && end_start + j == final_len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                ,0x18df,"void stb_sha1(stb_uchar *, stb_uchar *, stb_uint)");
}

Assistant:

void stb_sha1(stb_uchar output[20], stb_uchar *buffer, stb_uint len)
{
   unsigned char final_block[128];
   stb_uint end_start, final_len, j;
   int i;

   stb_uint h[5];

   h[0] = 0x67452301;
   h[1] = 0xefcdab89;
   h[2] = 0x98badcfe;
   h[3] = 0x10325476;
   h[4] = 0xc3d2e1f0;

   // we need to write padding to the last one or two
   // blocks, so build those first into 'final_block'

   // we have to write one special byte, plus the 8-byte length

   // compute the block where the data runs out
   end_start = len & ~63;

   // compute the earliest we can encode the length
   if (((len+9) & ~63) == end_start) {
      // it all fits in one block, so fill a second-to-last block
      end_start -= 64;
   }

   final_len = end_start + 128;

   // now we need to copy the data in
   assert(end_start + 128 >= len+9);
   assert(end_start < len || len < 64-9);

   j = 0;
   if (end_start > len)
      j = (stb_uint) - (int) end_start;

   for (; end_start + j < len; ++j)
      final_block[j] = buffer[end_start + j];
   final_block[j++] = 0x80;
   while (j < 128-5) // 5 byte length, so write 4 extra padding bytes
      final_block[j++] = 0;
   // big-endian size
   final_block[j++] = len >> 29;
   final_block[j++] = len >> 21;
   final_block[j++] = len >> 13;
   final_block[j++] = len >>  5;
   final_block[j++] = len <<  3;
   assert(j == 128 && end_start + j == final_len);

   for (j=0; j < final_len; j += 64) { // 512-bit chunks
      if (j+64 >= end_start+64)
         stb__sha1(&final_block[j - end_start], h);
      else
         stb__sha1(&buffer[j], h);
   }

   for (i=0; i < 5; ++i) {
      output[i*4 + 0] = h[i] >> 24;
      output[i*4 + 1] = h[i] >> 16;
      output[i*4 + 2] = h[i] >>  8;
      output[i*4 + 3] = h[i] >>  0;
   }
}